

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IBScpp.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  ostream *poVar2;
  ulong uVar3;
  string *__arg;
  pthread_t *ppVar4;
  long *plVar5;
  ulong uVar6;
  pthread_t *__newthread;
  long lVar7;
  ulong uVar8;
  vector<chromosome_inf,_std::allocator<chromosome_inf>_> local_168;
  undefined1 local_150 [8];
  vector<chromosome_inf,_std::allocator<chromosome_inf>_> chr_inf;
  undefined1 local_128 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  uint64_t local_108 [2];
  undefined1 local_f8 [8];
  vector<window_info,_std::allocator<window_info>_> tasks;
  undefined1 local_d8 [8];
  vector<void_*,_std::allocator<void_*>_> thread_res;
  string kmer_db_path;
  long local_98;
  long local_90 [2];
  uint local_80;
  uint local_7c;
  uint64_t local_78;
  undefined1 local_70 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> job_offset;
  vector<unsigned_long,_std::allocator<unsigned_long>_> job_count;
  allocator_type local_31;
  
  deal_args((args_st *)
            &thread_res.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage,argc,argv);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"kmer_db_path: ",0xe);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,
                      (char *)thread_res.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl
                              .super__Vector_impl_data._M_end_of_storage,
                      (long)kmer_db_path._M_dataplus._M_p);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"reference_file_path: ",0x15);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(char *)kmer_db_path.field_2._8_8_,local_98);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"threads: ",9);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"kmer_size: ",0xb);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"window_size: ",0xd);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  chr_inf.super__Vector_base<chromosome_inf,_std::allocator<chromosome_inf>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)local_128;
  std::__cxx11::string::_M_construct<char*>
            ((string *)
             &chr_inf.super__Vector_base<chromosome_inf,_std::allocator<chromosome_inf>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,kmer_db_path.field_2._8_8_,
             local_98 + kmer_db_path.field_2._8_8_);
  get_reference_inf((vector<chromosome_inf,_std::allocator<chromosome_inf>_> *)local_150,
                    (string *)
                    &chr_inf.super__Vector_base<chromosome_inf,_std::allocator<chromosome_inf>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage);
  if (chr_inf.super__Vector_base<chromosome_inf,_std::allocator<chromosome_inf>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)local_128) {
    operator_delete(chr_inf.super__Vector_base<chromosome_inf,_std::allocator<chromosome_inf>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)(local_128._0_8_ + 1));
  }
  std::vector<chromosome_inf,_std::allocator<chromosome_inf>_>::vector
            (&local_168,(vector<chromosome_inf,_std::allocator<chromosome_inf>_> *)local_150);
  produce_tasks_via_refernce
            ((vector<window_info,_std::allocator<window_info>_> *)local_f8,&local_168,local_78,
             (ulong)local_7c);
  std::vector<chromosome_inf,_std::allocator<chromosome_inf>_>::~vector(&local_168);
  local_118._M_allocated_capacity = (size_type)(local_128 + 0x20);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_128 + 0x10),
             thread_res.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage,
             kmer_db_path._M_dataplus._M_p +
             (long)thread_res.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage);
  tasks.super__Vector_base<window_info,_std::allocator<window_info>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)read_kmer_db_vector((string *)(local_128 + 0x10));
  if ((undefined1 *)local_118._M_allocated_capacity != local_128 + 0x20) {
    operator_delete((void *)local_118._M_allocated_capacity,local_108[0] + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"we total have ",0xe);
  uVar6 = ((long)tasks.super__Vector_base<window_info,_std::allocator<window_info>_>._M_impl.
                 super__Vector_impl_data._M_start - (long)local_f8 >> 4) * -0x5555555555555555;
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," tasks ",7);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"calc tasknum",0xc);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             &job_offset.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(ulong)local_80,(allocator_type *)local_70);
  uVar3 = ((long)job_count.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_start -
           (long)job_offset.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage >> 3) - 1;
  if (uVar3 != 0) {
    uVar8 = 0;
    do {
      job_offset.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage[uVar8] = (long)(int)(uVar6 / local_80);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\t",1);
      std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
      uVar8 = uVar8 + 1;
      uVar3 = ((long)job_count.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start -
               (long)job_offset.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage >> 3) - 1;
    } while (uVar8 < uVar3);
  }
  job_offset.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage[uVar3] =
       uVar6 - *job_offset.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage * uVar3;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\t",1);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"calc offset",0xb);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_70,(ulong)local_80,
             (allocator_type *)local_d8);
  *(unsigned_long *)local_70 = 0;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\t",1);
  std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
  if (8 < (ulong)((long)job_offset.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                        ._M_impl.super__Vector_impl_data._M_start - (long)local_70)) {
    uVar3 = 1;
    do {
      *(unsigned_long *)((long)local_70 + uVar3 * 8) =
           job_offset.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage[uVar3 - 1] +
           *(pointer)((long)local_70 + (uVar3 - 1) * 8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\t",1);
      std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
      uVar3 = uVar3 + 1;
    } while (uVar3 < (ulong)((long)job_offset.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_start - (long)local_70 >> 3))
    ;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"create threads",0xe);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  uVar3 = (ulong)local_80;
  __arg = (string *)calloc(uVar3,0x48);
  ppVar4 = (pthread_t *)calloc(uVar3,8);
  if (uVar3 != 0) {
    uVar3 = 0;
    __newthread = ppVar4;
    do {
      *(unsigned_long *)(__arg + 0x28) =
           job_offset.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage[uVar3];
      std::__cxx11::string::_M_assign(__arg);
      *(unsigned_long *)(__arg + 0x20) = *(pointer)((long)local_70 + uVar3 * 8);
      *(undefined1 **)(__arg + 0x38) = local_150;
      *(undefined1 **)(__arg + 0x30) = local_f8;
      *(pointer *)(__arg + 0x40) =
           tasks.super__Vector_base<window_info,_std::allocator<window_info>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      iVar1 = pthread_create(__newthread,(pthread_attr_t *)0x0,thread_func,__arg);
      if (iVar1 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"pthread_create error: error_code=",0x21);
        plVar5 = (long *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
        std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
        std::ostream::put((char)plVar5);
        std::ostream::flush();
      }
      uVar3 = uVar3 + 1;
      __newthread = __newthread + 1;
      __arg = __arg + 0x48;
    } while (uVar3 < local_80);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"waiting threads",0xf);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  std::vector<void_*,_std::allocator<void_*>_>::vector
            ((vector<void_*,_std::allocator<void_*>_> *)local_d8,(ulong)local_80,&local_31);
  if (local_80 != 0) {
    lVar7 = 0;
    uVar3 = 0;
    do {
      iVar1 = pthread_join(ppVar4[uVar3],(void **)((long)local_d8 + lVar7));
      if (iVar1 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"pthread_join error: error_code=",0x1f);
        plVar5 = (long *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
        std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
        std::ostream::put((char)plVar5);
        std::ostream::flush();
      }
      uVar3 = uVar3 + 1;
      lVar7 = lVar7 + 8;
    } while (uVar3 < local_80);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "seqname\tstart\tend\ttotal_kmers\tobserved_kmers\tvariations\tkmer_distance",0x45);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  std::ostream::put(-0x70);
  std::ostream::flush();
  if (local_80 != 0) {
    uVar3 = 0;
    do {
      if (job_offset.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage[uVar3] != 0) {
        lVar7 = (long)*(pointer)((long)local_d8 + uVar3 * 8) + 0x48;
        uVar6 = 0;
        do {
          poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,*(char **)(lVar7 + -0x48),
                              *(long *)(lVar7 + -0x40));
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\t",1);
          poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\t",1);
          poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\t",1);
          poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\t",1);
          poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\t",1);
          poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\t",1);
          poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
          std::ostream::put((char)poVar2);
          std::ostream::flush();
          uVar6 = uVar6 + 1;
          lVar7 = lVar7 + 0x50;
        } while (uVar6 < job_offset.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage[uVar3]);
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < local_80);
  }
  if (local_d8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_d8,
                    (long)thread_res.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)local_d8);
  }
  if (local_70 != (undefined1  [8])0x0) {
    operator_delete((void *)local_70,
                    (long)job_offset.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)local_70);
  }
  if (job_offset.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(job_offset.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,
                    (long)job_count.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)job_offset.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
  }
  std::vector<window_info,_std::allocator<window_info>_>::~vector
            ((vector<window_info,_std::allocator<window_info>_> *)local_f8);
  std::vector<chromosome_inf,_std::allocator<chromosome_inf>_>::~vector
            ((vector<chromosome_inf,_std::allocator<chromosome_inf>_> *)local_150);
  if ((long *)kmer_db_path.field_2._8_8_ != local_90) {
    operator_delete((void *)kmer_db_path.field_2._8_8_,local_90[0] + 1);
  }
  if (thread_res.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data
      ._M_end_of_storage != (pointer)&kmer_db_path._M_string_length) {
    operator_delete(thread_res.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,kmer_db_path._M_string_length + 1);
  }
  return 0;
}

Assistant:

int main(int argc, char* argv[]){
    //load and check parameters
    auto [kmer_db_path, reference_file_path , threads , kmer_size, window_size] = deal_args(argc,argv);

    //log
    cerr << "kmer_db_path: " << kmer_db_path << endl;
    cerr << "reference_file_path: " << reference_file_path << endl;
    cerr << "threads: " << threads << endl;
    cerr << "kmer_size: " << kmer_size << endl;
    cerr << "window_size: " << window_size << endl;

    //deal reference file
    vector<chromosome_inf> chr_inf =  get_reference_inf(reference_file_path);


    //get tasks list
    vector<window_info> tasks =  produce_tasks_via_refernce(chr_inf,window_size,kmer_size);


    //get reference map,this is an alternative.
    //No significant speed improvement, increased memory usage.so discard
    // map<string, string> * ref = get_reference_map(reference_file_path);


    //read kmers database
    //method 1, slow in loading process,more mem usage.
    // KmerUint64Hash1* kmers =  read_kmer_db_hash(  kmer_db_path);  
    //method 2, slow in loading process
    // KmersSet * kmers = load_kmer_raw_file2(kmer_db_path, 10000, false);
    //method 3, low mem usage,more faster 
    vector<uint64_t> *kmers = read_kmer_db_vector(  kmer_db_path);   

    //Assigning Tasks
    uint64_t tasks_num = tasks.size();
    cerr << "we total have " <<  tasks_num<< " tasks "<<endl;

    //calc tasknum for each thread
    cerr<<"calc tasknum"<<endl;
    vector<uint64_t> job_count(threads);
    for(size_t i=0;i<job_count.size()-1;i++){
        job_count[i]=(int)(tasks_num/threads);
        cerr << "\t" << job_count[i]; //
    }
    job_count[job_count.size()-1] = tasks_num-(job_count[0]*(job_count.size()-1));
    cerr << "\t" << job_count[job_count.size()-1] << "\n";// 

    

    //calc task offset for each thread
    cerr<<"calc offset"<<endl;
    vector<uint64_t> job_offset(threads);
    job_offset[0]=0;
    cerr << "\t" << job_offset[0] ; //
    for(size_t i=1;i<job_offset.size();i++){
        job_offset[i]=job_offset[i-1] + job_count[i-1];
        cerr << "\t" << job_offset[i]; //
    }
    cerr <<"\n"<<endl;

    // create the threads 
    cerr<<"create threads"<<endl;
    struct thread_data * td = (struct thread_data *)calloc(threads,sizeof(thread_data));
    pthread_t * tids=(pthread_t *)calloc(threads,sizeof(pthread_t));
    for(size_t i = 0; i < threads; ++i)
    {
        (td+i)->jobcount = job_count[i];
        (td+i)->reference =reference_file_path ;
        (td+i)->joboffset = job_offset[i];
        // vector<chromosome_inf> &tmp_chr_inf = chr_inf;
        (td+i)->chr_inf = &chr_inf;
        // vector<window_info> &tmp_tasks = tasks;
        (td+i)->tasks = &tasks;
        (td+i)->kmers = kmers;
        // (td+i)->ref = ref;
        //参数依次是：创建的线程id，线程参数，调用的函数，传入的函数参数
        int ret = pthread_create(tids+i, NULL, thread_func,(void *)(td+i));
        if (ret != 0)
        {
            cerr << "pthread_create error: error_code=" << ret << endl;
        }
    }


    //thread join
    cerr<<"waiting threads"<<endl;
    vector<void *> thread_res(threads);
    for(size_t i = 0; i < threads; ++i)
    {
        int ret = pthread_join ( *(tids+i), &thread_res[i] );
        if (ret != 0)
        {
            cerr << "pthread_join error: error_code=" << ret << endl;
        }

    }
    
    cout << "seqname\tstart\tend\ttotal_kmers\tobserved_kmers\tvariations\tkmer_distance" << endl;

    for(size_t i = 0; i < threads; ++i)
    {
        struct result * tmp_res = (struct result *)thread_res[i];
        for (size_t j=0;j < job_count[i];j++){
            cout << (tmp_res+j)->seqname << "\t";
            cout << (tmp_res+j)->start << "\t";
            cout << (tmp_res+j)->end << "\t";
            cout << (tmp_res+j)->total_kmers << "\t";
            cout << (tmp_res+j)->observed_kmers << "\t";
            cout << (tmp_res+j)->variations << "\t";
            cout << (tmp_res+j)->kmer_distance << endl;
        }

    }

    return 0;
}